

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

ALLEGRO_EVENT_QUEUE * al_create_event_queue(void)

{
  ALLEGRO_EVENT_QUEUE *vec;
  _AL_LIST_ITEM *p_Var1;
  
  vec = (ALLEGRO_EVENT_QUEUE *)
        al_malloc_with_context
                  (0xb8,0x5c,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/events.c"
                   ,"al_create_event_queue");
  if (vec != (ALLEGRO_EVENT_QUEUE *)0x0) {
    _al_vector_init((_AL_VECTOR *)vec,8);
    _al_vector_init(&vec->events,0x48);
    _al_vector_alloc_back(&vec->events);
    (vec->mutex).inited = false;
    vec->paused = false;
    vec->events_head = 0;
    vec->events_tail = 0;
    _al_mutex_init(&vec->mutex);
    pthread_cond_init((pthread_cond_t *)&vec->cond,(pthread_condattr_t *)0x0);
    p_Var1 = _al_register_destructor(_al_dtor_list,"queue",vec,al_destroy_event_queue);
    vec->dtor_item = p_Var1;
  }
  return vec;
}

Assistant:

ALLEGRO_EVENT_QUEUE *al_create_event_queue(void)
{
   ALLEGRO_EVENT_QUEUE *queue = al_malloc(sizeof *queue);

   ASSERT(queue);

   if (queue) {
      _al_vector_init(&queue->sources, sizeof(ALLEGRO_EVENT_SOURCE *));

      _al_vector_init(&queue->events, sizeof(ALLEGRO_EVENT));
      _al_vector_alloc_back(&queue->events);
      queue->events_head = 0;
      queue->events_tail = 0;
      queue->paused = false;

      _AL_MARK_MUTEX_UNINITED(queue->mutex);
      _al_mutex_init(&queue->mutex);
      _al_cond_init(&queue->cond);

      queue->dtor_item = _al_register_destructor(_al_dtor_list, "queue", queue,
         (void (*)(void *)) al_destroy_event_queue);
   }

   return queue;
}